

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Directory::SetCurrentBinary(Directory *this,string *dir)

{
  string *path;
  PointerType pBVar1;
  PointerType pBVar2;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  pBVar1 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  path = &pBVar1->OutputLocation;
  std::__cxx11::string::_M_assign((string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  cmsys::SystemTools::CollapseFullPath(&local_60,path);
  std::__cxx11::string::operator=((string *)path,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  cmsys::SystemTools::SplitPath(path,&pBVar2->CurrentBinaryDirectoryComponents,true);
  ComputeRelativePathTopBinary(this);
  std::__cxx11::string::string((string *)&local_60,"CMAKE_CURRENT_BINARY_DIR",&local_61);
  std::__cxx11::string::string
            ((string *)&local_40,(pBVar1->OutputLocation)._M_dataplus._M_p,&local_62);
  Snapshot::SetDefinition(&this->Snapshot_,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmState::Directory::SetCurrentBinary(std::string const& dir)
{
  std::string& loc = this->DirectoryState->OutputLocation;
  loc = dir;
  cmSystemTools::ConvertToUnixSlashes(loc);
  loc = cmSystemTools::CollapseFullPath(loc);

  cmSystemTools::SplitPath(
      loc,
      this->DirectoryState->CurrentBinaryDirectoryComponents);
  this->ComputeRelativePathTopBinary();

  this->Snapshot_.SetDefinition("CMAKE_CURRENT_BINARY_DIR", loc.c_str());
}